

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

path * __thiscall ghc::filesystem::path::relative_path(path *__return_storage_ptr__,path *this)

{
  unsigned_long local_88;
  unsigned_long local_80;
  string_type local_78;
  string local_58 [32];
  string local_38 [8];
  string root;
  path *this_local;
  
  root.field_2._8_8_ = this;
  root_path((path *)local_58,this);
  std::__cxx11::string::string(local_38,local_58);
  ~path((path *)local_58);
  local_80 = std::__cxx11::string::length();
  local_88 = std::__cxx11::string::length();
  std::min<unsigned_long>(&local_80,&local_88);
  std::__cxx11::string::substr((ulong)&local_78,(ulong)this);
  path(__return_storage_ptr__,&local_78,generic_format);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string(local_38);
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path path::relative_path() const
{
    std::string root = root_path()._path;
    return path(_path.substr((std::min)(root.length(), _path.length())), generic_format);
}